

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

FilePath __thiscall testing::internal::FilePath::RemoveDirectoryName(FilePath *this)

{
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar1;
  FilePath *in_RSI;
  FilePath FVar2;
  String local_30;
  char *local_20;
  char *last_sep;
  FilePath *this_local;
  
  this_local = this;
  local_20 = FindLastPathSeparator(in_RSI);
  if (local_20 == (char *)0x0) {
    FilePath(this,in_RSI);
    sVar1 = extraout_RDX;
  }
  else {
    String::String(&local_30,local_20 + 1);
    FilePath(this,&local_30);
    String::~String(&local_30);
    sVar1 = extraout_RDX_00;
  }
  FVar2.pathname_.length_ = sVar1;
  FVar2.pathname_.c_str_ = (char *)this;
  return (FilePath)FVar2.pathname_;
}

Assistant:

FilePath FilePath::RemoveDirectoryName() const {
  const char* const last_sep = FindLastPathSeparator();
  return last_sep ? FilePath(String(last_sep + 1)) : *this;
}